

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_4_P::LoadableGetStateBlock_x
          (ChElementTetraCorot_4_P *this,int block_offset,ChState *mD)

{
  ulong uVar1;
  pointer psVar2;
  double *pdVar3;
  
  if (-1 < block_offset) {
    uVar1 = (mD->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if ((long)block_offset < (long)uVar1) {
      psVar2 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (mD->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar3[block_offset] =
           ((psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->P;
      if (block_offset + 1 < uVar1) {
        pdVar3[block_offset + 1] =
             (psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->P;
        if (block_offset + 2 < uVar1) {
          pdVar3[block_offset + 2] =
               (psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->P;
          if (block_offset + 3 < uVar1) {
            pdVar3[block_offset + 3] =
                 (psVar2[3].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->P;
            return;
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementTetraCorot_4_P::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD(block_offset) = this->nodes[0]->GetP();
    mD(block_offset + 1) = this->nodes[1]->GetP();
    mD(block_offset + 2) = this->nodes[2]->GetP();
    mD(block_offset + 3) = this->nodes[3]->GetP();
}